

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

xr_reader * __thiscall xray_re::xr_file_system::r_open(xr_file_system *this,char *path,char *name)

{
  path_alias *ppVar1;
  xr_reader *pxVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ppVar1 = find_path_alias(this,path);
  if (ppVar1 == (path_alias *)0x0) {
    pxVar2 = (xr_reader *)0x0;
  }
  else {
    std::operator+(&local_38,&ppVar1->root,name);
    pxVar2 = r_open(this,local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return pxVar2;
}

Assistant:

xr_reader* xr_file_system::r_open(const char* path, const char* name) const
{
	const path_alias* pa = find_path_alias(path);
	return pa ? r_open(pa->root + name) : 0;
}